

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.h
# Opt level: O3

void __thiscall chrono::ChRotSpringShape::~ChRotSpringShape(ChRotSpringShape *this)

{
  ChLineShape::~ChLineShape(&this->super_ChLineShape);
  free((void *)this[-1].m_resolution);
  return;
}

Assistant:

class ChApi ChRotSpringShape : public ChLineShape {
  public:
    ChRotSpringShape(double radius, int resolution = 65) : m_radius(radius), m_resolution(resolution) {}

    virtual void Update(ChPhysicsItem* updater, const ChFrame<>& coords) override;

  private:
    double m_radius;
    size_t m_resolution;
}